

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConfigLiblistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigLiblistSyntax,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Token liblist;
  ConfigLiblistSyntax *this_00;
  
  this_00 = (ConfigLiblistSyntax *)allocate(this,0x50,8);
  liblist.kind = args->kind;
  liblist._2_1_ = args->field_0x2;
  liblist.numFlags.raw = (args->numFlags).raw;
  liblist.rawLen = args->rawLen;
  liblist.info = args->info;
  slang::syntax::ConfigLiblistSyntax::ConfigLiblistSyntax(this_00,liblist,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }